

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_hlt_x86_64(CPUX86State *env,int next_eip_addend)

{
  ArchCPU *cpu_00;
  uintptr_t unaff_retaddr;
  X86CPU *cpu;
  int next_eip_addend_local;
  CPUX86State *env_local;
  
  cpu_00 = env_archcpu(env);
  cpu_svm_check_intercept_param_x86_64(env,0x78,0,unaff_retaddr);
  env->eip = (long)next_eip_addend + env->eip;
  do_hlt(cpu_00);
  return;
}

Assistant:

void helper_hlt(CPUX86State *env, int next_eip_addend)
{
    X86CPU *cpu = env_archcpu(env);

    cpu_svm_check_intercept_param(env, SVM_EXIT_HLT, 0, GETPC());
    env->eip += next_eip_addend;

    do_hlt(cpu);
}